

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O3

void __thiscall Entity::explode(Entity *this)

{
  float fVar1;
  Explosion *this_00;
  _List_node_base *p_Var2;
  
  fVar1 = this->radius;
  this_00 = (Explosion *)operator_new(0x40);
  Explosion::Explosion(this_00,this->x,this->y,32.0 <= fVar1);
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)this_00;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  new_entities_abi_cxx11_.super__List_base<Entity_*,_std::allocator<Entity_*>_>._M_impl._M_node.
  _M_size = new_entities_abi_cxx11_.super__List_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
            _M_node._M_size + 1;
  my_play_sample((uint)(fVar1 < 32.0) * 4 + 0x1b);
  return;
}

Assistant:

void Entity::explode(void)
{
   bool big;
   if (radius >= 32)
      big = true;
   else
      big = false;
   Explosion *e = new Explosion(x, y, big);
   new_entities.push_back(e);
   if (big)
      my_play_sample(RES_BIGEXPLOSION);
   else
      my_play_sample(RES_SMALLEXPLOSION);
}